

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

int trie_prefixes(trie t,trie_key key,vector prefixes)

{
  long lVar1;
  trie_node ptVar2;
  long in_RDX;
  long in_RSI;
  trie_key in_RDI;
  size_t index_iterator;
  trie_node node_iterator;
  void *in_stack_ffffffffffffffc8;
  vector v;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if ((((in_RDI == (trie_key)0x0) || (in_RSI == 0)) || (in_RDX == 0)) ||
     (ptVar2 = trie_node_find((trie)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI), ptVar2 == (trie_node)0x0)) {
    iVar3 = 1;
  }
  else {
    for (v = (vector)ptVar2->self_index; v != (vector)0x0; v = *(vector *)(lVar1 + (long)v * 0x28))
    {
      lVar1 = *(long *)((long)in_RDI + 8);
      vector_push_front(v,in_stack_ffffffffffffffc8);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int trie_prefixes(trie t, trie_key key, vector prefixes)
{
	if (t != NULL && key != NULL && prefixes != NULL)
	{
		trie_node node_iterator = trie_node_find(t, key);

		if (node_iterator != NULL)
		{
			size_t index_iterator;

			for (index_iterator = node_iterator->self_index; index_iterator > 0; index_iterator = node_iterator->parent_index)
			{
				node_iterator = &t->node_list[index_iterator];

				vector_push_front(prefixes, &node_iterator->key);
			}

			return 0;
		}
	}

	return 1;
}